

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::EraseRecords
          (WalletBatch *this,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *types)

{
  string_view process_desc;
  byte bVar1;
  WalletBatch *in_RSI;
  function<bool_(wallet::WalletBatch_&)> *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_00000038;
  function<bool_(wallet::WalletBatch_&)> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  function<bool_(wallet::WalletBatch_&)> *func;
  function<bool_(wallet::WalletBatch_&)> local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  func = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffa8,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::function<bool(wallet::WalletBatch&)>::
  function<wallet::WalletBatch::EraseRecords(std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&)::__0,void>
            (&local_38,(anon_class_8_1_a8b54799 *)in_RDI);
  process_desc._M_str = in_stack_00000038;
  process_desc._M_len = (size_t)this;
  bVar1 = RunWithinTxn(in_RSI,process_desc,func);
  std::function<bool_(wallet::WalletBatch_&)>::~function(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::EraseRecords(const std::unordered_set<std::string>& types)
{
    return RunWithinTxn(*this, "erase records", [&types](WalletBatch& self) {
        return std::all_of(types.begin(), types.end(), [&self](const std::string& type) {
            return self.m_batch->ErasePrefix(DataStream() << type);
        });
    });
}